

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

Scope * __thiscall flow::lang::Lexer::enterScope(Lexer *this,string *filename)

{
  int __v;
  byte bVar1;
  pointer pbVar2;
  system_error *this_00;
  int *piVar3;
  error_category *__ecat;
  Scope *pSVar4;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  local_38 [3];
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  local_20;
  __single_object ifs;
  string *filename_local;
  Lexer *this_local;
  
  ifs._M_t.
  super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
          )filename;
  std::make_unique<std::ifstream>();
  pbVar2 = std::
           unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           ::operator->(&local_20);
  std::ifstream::open(pbVar2,ifs._M_t.
                             super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl,8);
  std::
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ::operator->(&local_20);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    __v = *piVar3;
    __ecat = (error_category *)std::_V2::system_category();
    std::system_error::system_error(this_00,__v,__ecat);
    __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  std::unique_ptr<std::istream,std::default_delete<std::istream>>::
  unique_ptr<std::ifstream,std::default_delete<std::ifstream>,void>
            ((unique_ptr<std::istream,std::default_delete<std::istream>> *)local_38,&local_20);
  pSVar4 = enterScope(this,local_38,
                      (string *)
                      ifs._M_t.
                      super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr(local_38);
  std::
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr(&local_20);
  return pSVar4;
}

Assistant:

Lexer::Scope* Lexer::enterScope(const std::string& filename) {
  auto ifs = std::make_unique<std::ifstream>();

  ifs->open(filename);
  if (!ifs->good())
    throw std::system_error(errno, std::system_category());

  return enterScope(std::move(ifs), filename);
}